

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.hpp
# Opt level: O2

void __thiscall libtorrent::aux::peer_entry::peer_entry(peer_entry *this,peer_entry *param_1)

{
  undefined8 uVar1;
  
  ::std::__cxx11::string::string((string *)this,(string *)param_1);
  *(undefined8 *)((long)(this->pid).m_number._M_elems + 0xe) =
       *(undefined8 *)((long)(param_1->pid).m_number._M_elems + 0xe);
  uVar1 = *(undefined8 *)((param_1->pid).m_number._M_elems + 2);
  *(undefined8 *)(this->pid).m_number._M_elems = *(undefined8 *)(param_1->pid).m_number._M_elems;
  *(undefined8 *)((this->pid).m_number._M_elems + 2) = uVar1;
  return;
}

Assistant:

struct TORRENT_EXTRA_EXPORT peer_entry
	{
		std::string hostname;
		peer_id pid;
		std::uint16_t port;

		bool operator==(const peer_entry& p) const
		{ return pid == p.pid; }

		bool operator<(const peer_entry& p) const
		{ return pid < p.pid; }
	}